

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001705c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001705c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001705b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001705b8 = 0x2d2d2d2d2d2d2d;
    DAT_001705bf = 0x2d;
    _DAT_001705a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001705a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00170590 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170598 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170588 = 0x2d2d2d2d2d2d2d2d;
    DAT_001705cf = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }